

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::ParseFunctionGenerator
          (ParseFunctionGenerator *this,Descriptor *descriptor,int max_has_bit_index,
          Span<const_int> has_bit_indices,Span<const_int> inlined_string_indices,Options *options,
          MessageSCCAnalyzer *scc_analyzer,
          flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars,int index_in_file_messages)

{
  Descriptor *pDVar1;
  Options *pOVar2;
  Span<const_int> has_bit_indices_00;
  Span<const_int> inlined_string_indices_00;
  iterator __first;
  iterator __last;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  this_00;
  undefined1 qualified;
  MessageSCCAnalyzer *scc_analyzer_00;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> field_options;
  string local_160;
  Options *local_140;
  pointer local_138;
  TailCallTableInfo local_130;
  undefined1 local_a0 [8];
  pointer local_98;
  pointer pFStack_90;
  ParseFunctionGenerator *local_88;
  pointer pFStack_80;
  Span<const_google::protobuf::FieldDescriptor_*const> local_78;
  undefined1 local_68 [8];
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  fields;
  allocator<int> local_39;
  Options *local_38;
  Options *options_local;
  Descriptor *pDStack_28;
  int max_has_bit_index_local;
  Descriptor *descriptor_local;
  ParseFunctionGenerator *this_local;
  Span<const_int> has_bit_indices_local;
  
  has_bit_indices_local.ptr_ = (pointer)has_bit_indices.len_;
  this_local = (ParseFunctionGenerator *)has_bit_indices.ptr_;
  this->descriptor_ = descriptor;
  this->scc_analyzer_ = scc_analyzer;
  this->options_ = options;
  local_38 = options;
  options_local._4_4_ = max_has_bit_index;
  pDStack_28 = descriptor;
  descriptor_local = (Descriptor *)this;
  absl::lts_20250127::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_hash_map(&this->variables_,vars);
  std::
  unique_ptr<google::protobuf::internal::TailCallTableInfo,std::default_delete<google::protobuf::internal::TailCallTableInfo>>
  ::unique_ptr<std::default_delete<google::protobuf::internal::TailCallTableInfo>,void>
            ((unique_ptr<google::protobuf::internal::TailCallTableInfo,std::default_delete<google::protobuf::internal::TailCallTableInfo>>
              *)&this->tc_table_info_);
  __first = absl::lts_20250127::Span<const_int>::begin(&inlined_string_indices);
  __last = absl::lts_20250127::Span<const_int>::end(&inlined_string_indices);
  std::allocator<int>::allocator(&local_39);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&this->inlined_string_indices_,__first,__last,
             &local_39);
  std::allocator<int>::~allocator(&local_39);
  GetOrderedFields(&this->ordered_fields_,this->descriptor_);
  this->num_hasbits_ = options_local._4_4_;
  this->index_in_file_messages_ = index_in_file_messages;
  pDVar1 = this->descriptor_;
  absl::lts_20250127::Span<google::protobuf::FieldDescriptor_const*const>::
  Span<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,void,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,int>
            ((Span<google::protobuf::FieldDescriptor_const*const> *)&local_78,&this->ordered_fields_
            );
  scc_analyzer_00 = this->scc_analyzer_;
  pOVar2 = this->options_;
  local_88 = this_local;
  pFStack_80 = (pointer)has_bit_indices_local.ptr_;
  absl::lts_20250127::Span<int_const>::
  Span<std::vector<int,std::allocator<int>>,void,std::vector<int,std::allocator<int>>,int>
            ((Span<int_const> *)&local_98,&this->inlined_string_indices_);
  has_bit_indices_00.len_ = (size_type)pFStack_80;
  has_bit_indices_00.ptr_ = (pointer)local_88;
  inlined_string_indices_00.len_ = (size_type)pFStack_90;
  inlined_string_indices_00.ptr_ = (pointer)local_98;
  BuildFieldOptions((vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                     *)local_68,pDVar1,local_78,pOVar2,scc_analyzer_00,has_bit_indices_00,
                    inlined_string_indices_00);
  pDVar1 = this->descriptor_;
  pOVar2 = this->options_;
  absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FieldOptions_const>::
  Span<std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>,void,std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>,int>
            ((Span<google::protobuf::internal::TailCallTableInfo::FieldOptions_const> *)&local_140,
             (vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
              *)local_68);
  field_options.len_ = (size_type)scc_analyzer_00;
  field_options.ptr_ = local_138;
  BuildTcTableInfoFromDescriptor
            (&local_130,(ParseFunctionGenerator *)pDVar1,(Descriptor *)pOVar2,local_140,
             field_options);
  qualified = SUB81(local_140,0);
  std::
  make_unique<google::protobuf::internal::TailCallTableInfo,google::protobuf::internal::TailCallTableInfo>
            ((TailCallTableInfo *)local_a0);
  std::
  unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
  ::operator=(&this->tc_table_info_,
              (unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
               *)local_a0);
  std::
  unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
  ::~unique_ptr((unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
                 *)local_a0);
  protobuf::internal::TailCallTableInfo::~TailCallTableInfo(&local_130);
  SetCommonMessageDataVariables(this->descriptor_,&this->variables_);
  SetUnknownFieldsVariable(this->descriptor_,this->options_,&this->variables_);
  ClassName_abi_cxx11_(&local_160,(cpp *)pDStack_28,(Descriptor *)0x0,(bool)qualified);
  this_00 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&this->variables_,(key_arg<char[10]> *)0xa117a7);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ::~vector((vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             *)local_68);
  return;
}

Assistant:

ParseFunctionGenerator::ParseFunctionGenerator(
    const Descriptor* descriptor, int max_has_bit_index,
    absl::Span<const int> has_bit_indices,
    absl::Span<const int> inlined_string_indices, const Options& options,
    MessageSCCAnalyzer* scc_analyzer,
    const absl::flat_hash_map<absl::string_view, std::string>& vars,
    int index_in_file_messages)
    : descriptor_(descriptor),
      scc_analyzer_(scc_analyzer),
      options_(options),
      variables_(vars),
      // Copy the absl::Span into a vector owned by the class.
      inlined_string_indices_(inlined_string_indices.begin(),
                              inlined_string_indices.end()),
      ordered_fields_(GetOrderedFields(descriptor_)),
      num_hasbits_(max_has_bit_index),
      index_in_file_messages_(index_in_file_messages) {
  auto fields =
      BuildFieldOptions(descriptor_, ordered_fields_, options_, scc_analyzer_,
                        has_bit_indices, inlined_string_indices_);
  tc_table_info_ = std::make_unique<TailCallTableInfo>(
      BuildTcTableInfoFromDescriptor(descriptor_, options_, fields));
  SetCommonMessageDataVariables(descriptor_, &variables_);
  SetUnknownFieldsVariable(descriptor_, options_, &variables_);
  variables_["classname"] = ClassName(descriptor, false);
}